

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QPointer<QMdiSubWindow>_>::move
          (QList<QPointer<QMdiSubWindow>_> *this,qsizetype from,qsizetype to)

{
  Data *pDVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  QPointer<QMdiSubWindow> *pQVar4;
  long lVar5;
  
  if (from == to) {
    return;
  }
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QPointer<QMdiSubWindow>_> *)0x0);
  }
  pQVar2 = (this->d).ptr;
  if (from < to) {
    lVar5 = from * 0x10;
    pQVar4 = pQVar2 + from + 1;
    lVar3 = to << 4;
  }
  else {
    lVar5 = to * 0x10;
    lVar3 = from * 0x10;
    pQVar4 = pQVar2 + from;
  }
  std::_V2::__rotate<QPointer<QMdiSubWindow>*>
            ((long)&(pQVar2->wp).d + lVar5,pQVar4,(long)&pQVar2[1].wp.d + lVar3);
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }